

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

void cvui::internal::end(int theType)

{
  ulong uVar1;
  ulong uVar2;
  cvui_block_t *pcVar3;
  cvui_block_t *theBlock;
  undefined8 extraout_RAX;
  ulong uVar4;
  Size local_40;
  string local_38;
  
  pcVar3 = popBlock();
  if (pcVar3->type == theType) {
    if (gStackCount != -1) {
      theBlock = topBlock();
      uVar1._0_4_ = (pcVar3->rect).width;
      uVar1._4_4_ = (pcVar3->rect).height;
      uVar4 = CONCAT44(-(uint)((long)uVar1 < 0),-(uint)((int)(undefined4)uVar1 < 0));
      uVar2._0_4_ = (pcVar3->fill).width;
      uVar2._4_4_ = (pcVar3->fill).height;
      local_40 = (Size)(~uVar4 & uVar1 | uVar2 & uVar4);
      updateLayoutFlow(theBlock,&local_40);
    }
    return;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "Calling wrong type of end*(). E.g. endColumn() instead of endRow(). Check if your begin*() calls are matched with their appropriate end*() calls."
             ,"");
  error(4,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void end(int theType) {
		cvui_block_t& aBlock = popBlock();

		if (aBlock.type != theType) {
			error(4, "Calling wrong type of end*(). E.g. endColumn() instead of endRow(). Check if your begin*() calls are matched with their appropriate end*() calls.");
		}

		// If we still have blocks in the stack, we must update
		// the current top with the dimensions that were filled by
		// the newly popped block.

		if (!blockStackEmpty()) {
			cvui_block_t& aTop = topBlock();
			cv::Size aSize;

			// If the block has rect.width < 0 or rect.heigth < 0, it means the
			// user don't want to calculate the block's width/height. It's up to
			// us do to the math. In that case, we use the block's fill rect to find
			// out the occupied space. If the block's width/height is greater than
			// zero, then the user is very specific about the desired size. In that
			// case, we use the provided width/height, no matter what the fill rect
			// actually is.
			aSize.width = aBlock.rect.width < 0 ? aBlock.fill.width : aBlock.rect.width;
			aSize.height = aBlock.rect.height < 0 ? aBlock.fill.height : aBlock.rect.height;

			updateLayoutFlow(aTop, aSize);
		}
	}